

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kex.c
# Opt level: O2

int kex_method_curve25519_key_exchange(LIBSSH2_SESSION *session,key_exchange_state_low_t *key_state)

{
  uchar **data;
  libssh2_nonblocking_states lVar1;
  uint8_t *private_key;
  undefined8 uVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  int iVar5;
  uint uVar6;
  BIGNUM *pBVar7;
  size_t sVar8;
  uchar *puVar9;
  uchar *puVar10;
  LIBSSH2_CRYPT_METHOD *pLVar11;
  _LIBSSH2_MAC_METHOD *p_Var12;
  LIBSSH2_COMP_METHOD *pLVar13;
  char *pcVar14;
  ulong uVar15;
  uchar *puVar16;
  uchar *puVar17;
  size_t sVar18;
  EVP_MD_CTX *ctx;
  ulong uVar19;
  long lStackY_a0;
  EVP_MD_CTX *fingerprint_ctx;
  uchar *s;
  uchar *local_70;
  ulong local_68;
  uchar *server_public_key;
  uchar *server_host_key;
  size_t server_public_key_len;
  EVP_MD_CTX *local_48;
  uchar *local_40;
  size_t hostkey_len;
  
  iVar5 = 0;
  switch(key_state->state) {
  case libssh2_NB_state_idle:
    break;
  default:
    goto switchD_00113479_caseD_1;
  case libssh2_NB_state_created:
    goto switchD_00113479_caseD_2;
  case libssh2_NB_state_sent:
    sVar18 = key_state->request_len;
    goto LAB_0011353e;
  case libssh2_NB_state_sent1:
    goto switchD_00113479_caseD_4;
  case libssh2_NB_state_sent2:
    goto switchD_00113479_caseD_5;
  }
  key_state->public_key_oct = (uchar *)0x0;
  key_state->state = libssh2_NB_state_created;
switchD_00113479_caseD_2:
  s = (uchar *)0x0;
  pcVar14 = session->kex->name;
  iVar5 = strcmp(pcVar14,"curve25519-sha256@libssh.org");
  if ((iVar5 != 0) && (iVar5 = strcmp(pcVar14,"curve25519-sha256"), iVar5 != 0)) {
    pcVar14 = "Unknown KEX curve25519 curve type";
    iVar5 = -1;
LAB_00113672:
    iVar5 = _libssh2_error(session,iVar5,pcVar14);
    goto switchD_00113479_caseD_1;
  }
  iVar5 = _libssh2_curve25519_new
                    (session,&key_state->curve25519_public_key,&key_state->curve25519_private_key);
  if (iVar5 != 0) {
    pcVar14 = "Unable to create private key";
    goto LAB_00113672;
  }
  key_state->request[0] = '\x1e';
  s = key_state->request + 1;
  _libssh2_store_str(&s,(char *)key_state->curve25519_public_key,0x20);
  key_state->request_len = 0x25;
  key_state->state = libssh2_NB_state_sent;
  sVar18 = 0x25;
LAB_0011353e:
  iVar5 = _libssh2_transport_send(session,key_state->request,sVar18,(uchar *)0x0,0);
  if (iVar5 == -0x25) {
    return -0x25;
  }
  if (iVar5 != 0) {
    pcVar14 = "Unable to send ECDH_INIT";
    goto LAB_00113672;
  }
  key_state->state = libssh2_NB_state_sent1;
switchD_00113479_caseD_4:
  iVar5 = _libssh2_packet_require
                    (session,'\x1f',&key_state->data,&key_state->data_len,0,(uchar *)0x0,0,
                     &key_state->req_state);
  if (iVar5 == -0x25) {
    return -0x25;
  }
  if (iVar5 != 0) {
    pcVar14 = "Timeout waiting for ECDH_REPLY reply";
    goto LAB_00113672;
  }
  key_state->state = libssh2_NB_state_sent2;
switchD_00113479_caseD_5:
  uVar19 = key_state->data_len;
  if (uVar19 < 5) {
    iVar5 = _libssh2_error(session,-10,"Data is too short");
  }
  else {
    lVar1 = (key_state->exchange_state).state;
    iVar5 = 0;
    if (libssh2_NB_state_sent2 < lVar1) goto switchD_00113609_caseD_1;
    puVar9 = key_state->data;
    puVar17 = key_state->curve25519_public_key;
    private_key = key_state->curve25519_private_key;
    switch(lVar1) {
    case libssh2_NB_state_idle:
      pBVar7 = BN_new();
      (key_state->exchange_state).k = (BIGNUM *)pBVar7;
      (key_state->exchange_state).state = libssh2_NB_state_created;
      break;
    default:
      goto switchD_00113609_caseD_1;
    case libssh2_NB_state_created:
      break;
    case libssh2_NB_state_sent:
      goto switchD_00113609_caseD_3;
    case libssh2_NB_state_sent2:
      goto switchD_00113609_caseD_5;
    }
    local_70 = puVar9 + 1;
    s = puVar9;
    local_68 = uVar19;
    local_40 = puVar17;
    iVar5 = _libssh2_get_string((string_buf *)&s,&server_host_key,&hostkey_len);
    if (iVar5 != 0) {
      pcVar14 = "Unexpected curve25519 key length 2";
LAB_00113656:
      iVar5 = -0xe;
      goto LAB_00113d48;
    }
    session->server_hostkey_len = (uint32_t)hostkey_len;
    puVar9 = (uchar *)(*session->alloc)(hostkey_len & 0xffffffff,&session->abstract);
    session->server_hostkey = puVar9;
    if (puVar9 == (uchar *)0x0) {
      pcVar14 = "Unable to allocate memory for a copy of the host curve25519 key";
      goto LAB_001137ac;
    }
    memcpy(puVar9,(void *)CONCAT44(server_host_key._4_4_,(int)server_host_key),
           (ulong)session->server_hostkey_len);
    iVar5 = _libssh2_md5_init(&fingerprint_ctx);
    if (iVar5 != 0) {
      EVP_DigestUpdate((EVP_MD_CTX *)fingerprint_ctx,session->server_hostkey,
                       (ulong)session->server_hostkey_len);
      EVP_DigestFinal((EVP_MD_CTX *)fingerprint_ctx,session->server_hostkey_md5,(uint *)0x0);
      EVP_MD_CTX_free(fingerprint_ctx);
    }
    session->server_hostkey_md5_valid = (uint)(iVar5 != 0);
    iVar5 = _libssh2_sha1_init(&fingerprint_ctx);
    if (iVar5 != 0) {
      EVP_DigestUpdate((EVP_MD_CTX *)fingerprint_ctx,session->server_hostkey,
                       (ulong)session->server_hostkey_len);
      EVP_DigestFinal((EVP_MD_CTX *)fingerprint_ctx,session->server_hostkey_sha1,(uint *)0x0);
      EVP_MD_CTX_free(fingerprint_ctx);
    }
    session->server_hostkey_sha1_valid = (uint)(iVar5 != 0);
    iVar5 = _libssh2_sha256_init(&fingerprint_ctx);
    if (iVar5 != 0) {
      EVP_DigestUpdate((EVP_MD_CTX *)fingerprint_ctx,session->server_hostkey,
                       (ulong)session->server_hostkey_len);
      EVP_DigestFinal((EVP_MD_CTX *)fingerprint_ctx,session->server_hostkey_sha256,(uint *)0x0);
      EVP_MD_CTX_free(fingerprint_ctx);
    }
    session->server_hostkey_sha256_valid = (uint)(iVar5 != 0);
    iVar5 = (*session->hostkey->init)
                      (session,session->server_hostkey,(ulong)session->server_hostkey_len,
                       &session->server_hostkey_abstract);
    if (iVar5 != 0) {
      pcVar14 = "Unable to initialize hostkey importer curve25519";
      goto LAB_001137e9;
    }
    iVar5 = _libssh2_get_string((string_buf *)&s,&server_public_key,&server_public_key_len);
    if (iVar5 != 0) {
      pcVar14 = "Unexpected curve25519 key length";
      goto LAB_00113656;
    }
    if (CONCAT44(server_public_key_len._4_4_,(uint32_t)server_public_key_len) == 0x20) {
      iVar5 = _libssh2_get_string((string_buf *)&s,&(key_state->exchange_state).h_sig,
                                  &(key_state->exchange_state).h_sig_len);
      if (iVar5 != 0) {
        pcVar14 = "Unexpected curve25519 server sig length";
        goto LAB_001137e9;
      }
      iVar5 = _libssh2_curve25519_gen_k
                        (&(key_state->exchange_state).k,private_key,
                         (uint8_t *)CONCAT44(server_public_key._4_4_,(int)server_public_key));
      if (iVar5 != 0) {
        pcVar14 = "Unable to create curve25519 shared secret";
        iVar5 = -5;
        goto LAB_00113d48;
      }
      iVar5 = BN_num_bits((BIGNUM *)(key_state->exchange_state).k);
      (key_state->exchange_state).k_value_len = (long)((iVar5 + 7) / 8 + 5);
      uVar6 = BN_num_bits((BIGNUM *)(key_state->exchange_state).k);
      sVar18 = (key_state->exchange_state).k_value_len;
      if ((uVar6 & 7) != 0) {
        sVar18 = sVar18 - 1;
        (key_state->exchange_state).k_value_len = sVar18;
      }
      puVar9 = (uchar *)(*session->alloc)(sVar18,&session->abstract);
      (key_state->exchange_state).k_value = puVar9;
      if (puVar9 == (uchar *)0x0) {
        pcVar14 = "Unable to allocate buffer for K";
LAB_001137ac:
        iVar5 = -6;
        goto LAB_00113d48;
      }
      _libssh2_htonu32(puVar9,(int)(key_state->exchange_state).k_value_len - 4);
      uVar6 = BN_num_bits((BIGNUM *)(key_state->exchange_state).k);
      if ((uVar6 & 7) == 0) {
        (key_state->exchange_state).k_value[4] = '\0';
        lStackY_a0 = 5;
      }
      else {
        lStackY_a0 = 4;
      }
      BN_bn2bin((BIGNUM *)(key_state->exchange_state).k,
                (key_state->exchange_state).k_value + lStackY_a0);
      (key_state->exchange_state).exchange_hash = &fingerprint_ctx;
      _libssh2_sha256_init(&fingerprint_ctx);
      puVar17 = (session->local).banner;
      puVar9 = (key_state->exchange_state).h_sig_comp;
      if (puVar17 == (uchar *)0x0) {
        _libssh2_htonu32(puVar9,0x16);
        EVP_DigestUpdate((EVP_MD_CTX *)fingerprint_ctx,puVar9,4);
        pcVar14 = "SSH-2.0-libssh2_1.11.0";
        sVar8 = 0x16;
        ctx = (EVP_MD_CTX *)fingerprint_ctx;
      }
      else {
        sVar8 = strlen((char *)puVar17);
        _libssh2_htonu32(puVar9,(int)sVar8 - 2);
        EVP_DigestUpdate((EVP_MD_CTX *)fingerprint_ctx,puVar9,4);
        ctx = (EVP_MD_CTX *)fingerprint_ctx;
        pcVar14 = (char *)(session->local).banner;
        sVar8 = strlen(pcVar14);
        sVar8 = sVar8 - 2;
      }
      EVP_DigestUpdate(ctx,pcVar14,sVar8);
      sVar8 = strlen((char *)(session->remote).banner);
      _libssh2_htonu32(puVar9,(uint32_t)sVar8);
      EVP_DigestUpdate((EVP_MD_CTX *)fingerprint_ctx,puVar9,4);
      local_48 = (EVP_MD_CTX *)fingerprint_ctx;
      puVar17 = (session->remote).banner;
      sVar8 = strlen((char *)puVar17);
      EVP_DigestUpdate(local_48,puVar17,sVar8);
      _libssh2_htonu32(puVar9,(uint32_t)(session->local).kexinit_len);
      EVP_DigestUpdate((EVP_MD_CTX *)fingerprint_ctx,puVar9,4);
      EVP_DigestUpdate((EVP_MD_CTX *)fingerprint_ctx,(session->local).kexinit,
                       (session->local).kexinit_len);
      _libssh2_htonu32(puVar9,(uint32_t)(session->remote).kexinit_len);
      EVP_DigestUpdate((EVP_MD_CTX *)fingerprint_ctx,puVar9,4);
      EVP_DigestUpdate((EVP_MD_CTX *)fingerprint_ctx,(session->remote).kexinit,
                       (session->remote).kexinit_len);
      _libssh2_htonu32(puVar9,session->server_hostkey_len);
      EVP_DigestUpdate((EVP_MD_CTX *)fingerprint_ctx,puVar9,4);
      EVP_DigestUpdate((EVP_MD_CTX *)fingerprint_ctx,session->server_hostkey,
                       (ulong)session->server_hostkey_len);
      _libssh2_htonu32(puVar9,0x20);
      EVP_DigestUpdate((EVP_MD_CTX *)fingerprint_ctx,puVar9,4);
      EVP_DigestUpdate((EVP_MD_CTX *)fingerprint_ctx,local_40,0x20);
      _libssh2_htonu32(puVar9,(uint32_t)server_public_key_len);
      EVP_DigestUpdate((EVP_MD_CTX *)fingerprint_ctx,puVar9,4);
      EVP_DigestUpdate((EVP_MD_CTX *)fingerprint_ctx,
                       (void *)CONCAT44(server_public_key._4_4_,(int)server_public_key),
                       CONCAT44(server_public_key_len._4_4_,(uint32_t)server_public_key_len));
      EVP_DigestUpdate((EVP_MD_CTX *)fingerprint_ctx,(key_state->exchange_state).k_value,
                       (key_state->exchange_state).k_value_len);
      EVP_DigestFinal((EVP_MD_CTX *)fingerprint_ctx,puVar9,(uint *)0x0);
      EVP_MD_CTX_free(fingerprint_ctx);
      iVar5 = (*session->hostkey->sig_verify)
                        (session,(key_state->exchange_state).h_sig,
                         (key_state->exchange_state).h_sig_len,puVar9,0x20,
                         &session->server_hostkey_abstract);
      if (iVar5 != 0) {
        pcVar14 = "Unable to verify hostkey signature curve25519";
        iVar5 = -0xb;
        goto LAB_00113d48;
      }
      (key_state->exchange_state).c = '\x15';
      (key_state->exchange_state).state = libssh2_NB_state_sent;
switchD_00113609_caseD_3:
      iVar5 = _libssh2_transport_send(session,&(key_state->exchange_state).c,1,(uchar *)0x0,0);
      if (iVar5 == -0x25) {
        return -0x25;
      }
      if (iVar5 != 0) {
        pcVar14 = "Unable to send NEWKEYS message curve25519";
        goto LAB_00113d48;
      }
      (key_state->exchange_state).state = libssh2_NB_state_sent2;
switchD_00113609_caseD_5:
      data = &(key_state->exchange_state).tmp;
      iVar5 = _libssh2_packet_require
                        (session,'\x15',data,&(key_state->exchange_state).tmp_len,0,(uchar *)0x0,0,
                         &(key_state->exchange_state).req_state);
      if (iVar5 == -0x25) {
        return -0x25;
      }
      if (iVar5 != 0) {
        pcVar14 = "Timed out waiting for NEWKEYS curve25519";
        goto LAB_00113d48;
      }
      *(byte *)&session->state = (byte)session->state | 2;
      (*session->free)(*data,&session->abstract);
      if (session->session_id == (uchar *)0x0) {
        puVar9 = (uchar *)(*session->alloc)(0x20,&session->abstract);
        session->session_id = puVar9;
        if (puVar9 == (uchar *)0x0) {
          pcVar14 = "Unable to allocate buffer for SHA digest";
          goto LAB_001137ac;
        }
        uVar2 = *(undefined8 *)(key_state->exchange_state).h_sig_comp;
        uVar3 = *(undefined8 *)((key_state->exchange_state).h_sig_comp + 8);
        uVar4 = *(undefined8 *)((key_state->exchange_state).h_sig_comp + 0x18);
        *(undefined8 *)(puVar9 + 0x10) =
             *(undefined8 *)((key_state->exchange_state).h_sig_comp + 0x10);
        *(undefined8 *)(puVar9 + 0x18) = uVar4;
        *(undefined8 *)puVar9 = uVar2;
        *(undefined8 *)(puVar9 + 8) = uVar3;
        session->session_id_len = 0x20;
      }
      pLVar11 = (session->local).crypt;
      if (pLVar11->dtor != (_func_int_LIBSSH2_SESSION_ptr_void_ptr_ptr *)0x0) {
        (*pLVar11->dtor)(session,&(session->local).crypt_abstract);
        pLVar11 = (session->local).crypt;
      }
      if (pLVar11->init ==
          (_func_int_LIBSSH2_SESSION_ptr_LIBSSH2_CRYPT_METHOD_ptr_uchar_ptr_int_ptr_uchar_ptr_int_ptr_int_void_ptr_ptr
           *)0x0) {
LAB_00113f3c:
        pLVar11 = (session->remote).crypt;
        if (pLVar11->dtor != (_func_int_LIBSSH2_SESSION_ptr_void_ptr_ptr *)0x0) {
          (*pLVar11->dtor)(session,&(session->remote).crypt_abstract);
          pLVar11 = (session->remote).crypt;
        }
        if (pLVar11->init !=
            (_func_int_LIBSSH2_SESSION_ptr_LIBSSH2_CRYPT_METHOD_ptr_uchar_ptr_int_ptr_uchar_ptr_int_ptr_int_void_ptr_ptr
             *)0x0) {
          server_public_key._0_4_ = 0;
          server_host_key._0_4_ = 0;
          puVar9 = (uchar *)(*session->alloc)((long)pLVar11->iv_len + 0x20,&session->abstract);
          if (puVar9 == (uchar *)0x0) goto LAB_00114152;
          puVar17 = (key_state->exchange_state).h_sig_comp;
          for (uVar19 = 0; pLVar11 = (session->remote).crypt, uVar19 < (ulong)(long)pLVar11->iv_len;
              uVar19 = uVar19 + 0x20) {
            _libssh2_sha256_init((EVP_MD_CTX **)&s);
            EVP_DigestUpdate((EVP_MD_CTX *)s,(key_state->exchange_state).k_value,
                             (key_state->exchange_state).k_value_len);
            EVP_DigestUpdate((EVP_MD_CTX *)s,puVar17,0x20);
            uVar15 = uVar19;
            puVar10 = puVar9;
            if (uVar19 == 0) {
              EVP_DigestUpdate((EVP_MD_CTX *)s,"B",1);
              uVar15 = (ulong)session->session_id_len;
              puVar10 = session->session_id;
            }
            EVP_DigestUpdate((EVP_MD_CTX *)s,puVar10,uVar15);
            EVP_DigestFinal((EVP_MD_CTX *)s,puVar9 + uVar19,(uint *)0x0);
            EVP_MD_CTX_free(s);
          }
          puVar10 = (uchar *)(*session->alloc)((long)pLVar11->secret_len + 0x20,&session->abstract);
          if (puVar10 == (uchar *)0x0) goto LAB_0011414b;
          for (uVar19 = 0; pLVar11 = (session->remote).crypt,
              uVar19 < (ulong)(long)pLVar11->secret_len; uVar19 = uVar19 + 0x20) {
            _libssh2_sha256_init((EVP_MD_CTX **)&s);
            EVP_DigestUpdate((EVP_MD_CTX *)s,(key_state->exchange_state).k_value,
                             (key_state->exchange_state).k_value_len);
            EVP_DigestUpdate((EVP_MD_CTX *)s,puVar17,0x20);
            uVar15 = uVar19;
            puVar16 = puVar10;
            if (uVar19 == 0) {
              EVP_DigestUpdate((EVP_MD_CTX *)s,"D",1);
              uVar15 = (ulong)session->session_id_len;
              puVar16 = session->session_id;
            }
            EVP_DigestUpdate((EVP_MD_CTX *)s,puVar16,uVar15);
            EVP_DigestFinal((EVP_MD_CTX *)s,puVar10 + uVar19,(uint *)0x0);
            EVP_MD_CTX_free(s);
          }
          iVar5 = (*pLVar11->init)(session,pLVar11,puVar9,(int *)&server_public_key,puVar10,
                                   (int *)&server_host_key,0,&(session->remote).crypt_abstract);
          puVar17 = puVar9;
          if (iVar5 != 0) goto LAB_0011413e;
          if ((int)server_public_key != 0) {
            explicit_bzero(puVar9,(long)((session->remote).crypt)->iv_len);
            (*session->free)(puVar9,&session->abstract);
          }
          if ((int)server_host_key != 0) {
            explicit_bzero(puVar10,(long)((session->remote).crypt)->secret_len);
            (*session->free)(puVar10,&session->abstract);
          }
        }
        p_Var12 = (session->local).mac;
        if (p_Var12->dtor != (_func_int_LIBSSH2_SESSION_ptr_void_ptr_ptr *)0x0) {
          (*p_Var12->dtor)(session,&(session->local).mac_abstract);
          p_Var12 = (session->local).mac;
        }
        if (p_Var12->init != (_func_int_LIBSSH2_SESSION_ptr_uchar_ptr_int_ptr_void_ptr_ptr *)0x0) {
          server_public_key._0_4_ = 0;
          puVar9 = (uchar *)(*session->alloc)((long)p_Var12->key_len + 0x20,&session->abstract);
          if (puVar9 == (uchar *)0x0) goto LAB_00114152;
          for (uVar19 = 0; p_Var12 = (session->local).mac, uVar19 < (ulong)(long)p_Var12->key_len;
              uVar19 = uVar19 + 0x20) {
            _libssh2_sha256_init((EVP_MD_CTX **)&s);
            EVP_DigestUpdate((EVP_MD_CTX *)s,(key_state->exchange_state).k_value,
                             (key_state->exchange_state).k_value_len);
            EVP_DigestUpdate((EVP_MD_CTX *)s,(key_state->exchange_state).h_sig_comp,0x20);
            uVar15 = uVar19;
            puVar17 = puVar9;
            if (uVar19 == 0) {
              EVP_DigestUpdate((EVP_MD_CTX *)s,"E",1);
              uVar15 = (ulong)session->session_id_len;
              puVar17 = session->session_id;
            }
            EVP_DigestUpdate((EVP_MD_CTX *)s,puVar17,uVar15);
            EVP_DigestFinal((EVP_MD_CTX *)s,puVar9 + uVar19,(uint *)0x0);
            EVP_MD_CTX_free(s);
          }
          (*p_Var12->init)(session,puVar9,(int *)&server_public_key,&(session->local).mac_abstract);
          if ((int)server_public_key != 0) {
            explicit_bzero(puVar9,(long)((session->local).mac)->key_len);
            (*session->free)(puVar9,&session->abstract);
          }
        }
        p_Var12 = (session->remote).mac;
        if (p_Var12->dtor != (_func_int_LIBSSH2_SESSION_ptr_void_ptr_ptr *)0x0) {
          (*p_Var12->dtor)(session,&(session->remote).mac_abstract);
          p_Var12 = (session->remote).mac;
        }
        if (p_Var12->init != (_func_int_LIBSSH2_SESSION_ptr_uchar_ptr_int_ptr_void_ptr_ptr *)0x0) {
          server_public_key._0_4_ = 0;
          puVar9 = (uchar *)(*session->alloc)((long)p_Var12->key_len + 0x20,&session->abstract);
          if (puVar9 == (uchar *)0x0) goto LAB_00114152;
          for (uVar19 = 0; p_Var12 = (session->remote).mac, uVar19 < (ulong)(long)p_Var12->key_len;
              uVar19 = uVar19 + 0x20) {
            _libssh2_sha256_init((EVP_MD_CTX **)&s);
            EVP_DigestUpdate((EVP_MD_CTX *)s,(key_state->exchange_state).k_value,
                             (key_state->exchange_state).k_value_len);
            EVP_DigestUpdate((EVP_MD_CTX *)s,(key_state->exchange_state).h_sig_comp,0x20);
            uVar15 = uVar19;
            puVar17 = puVar9;
            if (uVar19 == 0) {
              EVP_DigestUpdate((EVP_MD_CTX *)s,"F",1);
              uVar15 = (ulong)session->session_id_len;
              puVar17 = session->session_id;
            }
            EVP_DigestUpdate((EVP_MD_CTX *)s,puVar17,uVar15);
            EVP_DigestFinal((EVP_MD_CTX *)s,puVar9 + uVar19,(uint *)0x0);
            EVP_MD_CTX_free(s);
          }
          (*p_Var12->init)(session,puVar9,(int *)&server_public_key,&(session->remote).mac_abstract)
          ;
          if ((int)server_public_key != 0) {
            explicit_bzero(puVar9,(long)((session->remote).mac)->key_len);
            (*session->free)(puVar9,&session->abstract);
          }
        }
        pLVar13 = (session->local).comp;
        if (pLVar13 != (LIBSSH2_COMP_METHOD *)0x0) {
          if (pLVar13->dtor != (_func_int_LIBSSH2_SESSION_ptr_int_void_ptr_ptr *)0x0) {
            (*pLVar13->dtor)(session,1,&(session->local).comp_abstract);
            pLVar13 = (session->local).comp;
            if (pLVar13 == (LIBSSH2_COMP_METHOD *)0x0) goto LAB_0011445e;
          }
          if ((pLVar13->init != (_func_int_LIBSSH2_SESSION_ptr_int_void_ptr_ptr *)0x0) &&
             (iVar5 = (*pLVar13->init)(session,1,&(session->local).comp_abstract), iVar5 != 0))
          goto LAB_00114152;
        }
LAB_0011445e:
        pLVar13 = (session->remote).comp;
        iVar5 = 0;
        if (pLVar13 != (LIBSSH2_COMP_METHOD *)0x0) {
          if (pLVar13->dtor != (_func_int_LIBSSH2_SESSION_ptr_int_void_ptr_ptr *)0x0) {
            iVar5 = 0;
            (*pLVar13->dtor)(session,0,&(session->remote).comp_abstract);
            pLVar13 = (session->remote).comp;
            if (pLVar13 == (LIBSSH2_COMP_METHOD *)0x0) goto switchD_00113609_caseD_1;
          }
          iVar5 = 0;
          if (pLVar13->init != (_func_int_LIBSSH2_SESSION_ptr_int_void_ptr_ptr *)0x0) {
            iVar5 = (*pLVar13->init)(session,0,&(session->remote).comp_abstract);
            iVar5 = (uint)(iVar5 == 0) * 5 + -5;
          }
        }
      }
      else {
        server_public_key._0_4_ = 0;
        server_host_key._0_4_ = 0;
        puVar9 = (uchar *)(*session->alloc)((long)pLVar11->iv_len + 0x20,&session->abstract);
        if (puVar9 == (uchar *)0x0) {
          iVar5 = -1;
          goto switchD_00113609_caseD_1;
        }
        puVar17 = (key_state->exchange_state).h_sig_comp;
        for (uVar19 = 0; pLVar11 = (session->local).crypt, uVar19 < (ulong)(long)pLVar11->iv_len;
            uVar19 = uVar19 + 0x20) {
          _libssh2_sha256_init((EVP_MD_CTX **)&s);
          EVP_DigestUpdate((EVP_MD_CTX *)s,(key_state->exchange_state).k_value,
                           (key_state->exchange_state).k_value_len);
          EVP_DigestUpdate((EVP_MD_CTX *)s,puVar17,0x20);
          uVar15 = uVar19;
          puVar10 = puVar9;
          if (uVar19 == 0) {
            EVP_DigestUpdate((EVP_MD_CTX *)s,"A",1);
            uVar15 = (ulong)session->session_id_len;
            puVar10 = session->session_id;
          }
          EVP_DigestUpdate((EVP_MD_CTX *)s,puVar10,uVar15);
          EVP_DigestFinal((EVP_MD_CTX *)s,puVar9 + uVar19,(uint *)0x0);
          EVP_MD_CTX_free(s);
        }
        puVar10 = (uchar *)(*session->alloc)((long)pLVar11->secret_len + 0x20,&session->abstract);
        if (puVar10 != (uchar *)0x0) {
          for (uVar19 = 0; pLVar11 = (session->local).crypt,
              uVar19 < (ulong)(long)pLVar11->secret_len; uVar19 = uVar19 + 0x20) {
            _libssh2_sha256_init((EVP_MD_CTX **)&s);
            EVP_DigestUpdate((EVP_MD_CTX *)s,(key_state->exchange_state).k_value,
                             (key_state->exchange_state).k_value_len);
            EVP_DigestUpdate((EVP_MD_CTX *)s,puVar17,0x20);
            uVar15 = uVar19;
            puVar16 = puVar10;
            if (uVar19 == 0) {
              EVP_DigestUpdate((EVP_MD_CTX *)s,"C",1);
              uVar15 = (ulong)session->session_id_len;
              puVar16 = session->session_id;
            }
            EVP_DigestUpdate((EVP_MD_CTX *)s,puVar16,uVar15);
            EVP_DigestFinal((EVP_MD_CTX *)s,puVar10 + uVar19,(uint *)0x0);
            EVP_MD_CTX_free(s);
          }
          iVar5 = (*pLVar11->init)(session,pLVar11,puVar9,(int *)&server_public_key,puVar10,
                                   (int *)&server_host_key,1,&(session->local).crypt_abstract);
          puVar17 = puVar9;
          if (iVar5 == 0) {
            if ((int)server_public_key != 0) {
              explicit_bzero(puVar9,(long)((session->local).crypt)->iv_len);
              (*session->free)(puVar9,&session->abstract);
            }
            if ((int)server_host_key != 0) {
              explicit_bzero(puVar10,(long)((session->local).crypt)->secret_len);
              (*session->free)(puVar10,&session->abstract);
            }
            goto LAB_00113f3c;
          }
LAB_0011413e:
          puVar9 = puVar10;
          (*session->free)(puVar17,&session->abstract);
        }
LAB_0011414b:
        (*session->free)(puVar9,&session->abstract);
LAB_00114152:
        iVar5 = -5;
      }
    }
    else {
      pcVar14 = "Unexpected curve25519 server public key length";
LAB_001137e9:
      iVar5 = -10;
LAB_00113d48:
      iVar5 = _libssh2_error(session,iVar5,pcVar14);
    }
switchD_00113609_caseD_1:
    BN_clear_free((BIGNUM *)(key_state->exchange_state).k);
    (key_state->exchange_state).k = (BIGNUM *)0x0;
    puVar9 = (key_state->exchange_state).k_value;
    if (puVar9 != (uchar *)0x0) {
      (*session->free)(puVar9,&session->abstract);
      (key_state->exchange_state).k_value = (uchar *)0x0;
    }
    (key_state->exchange_state).state = libssh2_NB_state_idle;
  }
  if (iVar5 == -0x25) {
    return -0x25;
  }
  (*session->free)(key_state->data,&session->abstract);
switchD_00113479_caseD_1:
  if (key_state->curve25519_public_key != (uchar *)0x0) {
    explicit_bzero(key_state->curve25519_public_key,0x20);
    (*session->free)(key_state->curve25519_public_key,&session->abstract);
    key_state->curve25519_public_key = (uchar *)0x0;
  }
  if (key_state->curve25519_private_key != (uchar *)0x0) {
    explicit_bzero(key_state->curve25519_private_key,0x20);
    (*session->free)(key_state->curve25519_private_key,&session->abstract);
    key_state->curve25519_private_key = (uchar *)0x0;
  }
  key_state->state = libssh2_NB_state_idle;
  return iVar5;
}

Assistant:

static int
kex_method_curve25519_key_exchange
(LIBSSH2_SESSION * session, key_exchange_state_low_t * key_state)
{
    int ret = 0;
    int rc = 0;

    if(key_state->state == libssh2_NB_state_idle) {

        key_state->public_key_oct = NULL;
        key_state->state = libssh2_NB_state_created;
    }

    if(key_state->state == libssh2_NB_state_created) {
        unsigned char *s = NULL;

        rc = strcmp(session->kex->name, "curve25519-sha256@libssh.org");
        if(rc)
            rc = strcmp(session->kex->name, "curve25519-sha256");

        if(rc) {
            ret = _libssh2_error(session, -1,
                                 "Unknown KEX curve25519 curve type");
            goto clean_exit;
        }

        rc = _libssh2_curve25519_new(session,
                                     &key_state->curve25519_public_key,
                                     &key_state->curve25519_private_key);

        if(rc) {
            ret = _libssh2_error(session, rc,
                                 "Unable to create private key");
            goto clean_exit;
        }

        key_state->request[0] = SSH2_MSG_KEX_ECDH_INIT;
        s = key_state->request + 1;
        _libssh2_store_str(&s, (const char *)key_state->curve25519_public_key,
                           LIBSSH2_ED25519_KEY_LEN);
        key_state->request_len = LIBSSH2_ED25519_KEY_LEN + 5;

        _libssh2_debug((session, LIBSSH2_TRACE_KEX,
                       "Initiating curve25519 SHA2"));

        key_state->state = libssh2_NB_state_sent;
    }

    if(key_state->state == libssh2_NB_state_sent) {
        rc = _libssh2_transport_send(session, key_state->request,
                                     key_state->request_len, NULL, 0);
        if(rc == LIBSSH2_ERROR_EAGAIN) {
            return rc;
        }
        else if(rc) {
            ret = _libssh2_error(session, rc,
                                 "Unable to send ECDH_INIT");
            goto clean_exit;
        }

        key_state->state = libssh2_NB_state_sent1;
    }

    if(key_state->state == libssh2_NB_state_sent1) {
        rc = _libssh2_packet_require(session, SSH2_MSG_KEX_ECDH_REPLY,
                                     &key_state->data, &key_state->data_len,
                                     0, NULL, 0, &key_state->req_state);
        if(rc == LIBSSH2_ERROR_EAGAIN) {
            return rc;
        }
        else if(rc) {
            ret = _libssh2_error(session, rc,
                                 "Timeout waiting for ECDH_REPLY reply");
            goto clean_exit;
        }

        key_state->state = libssh2_NB_state_sent2;
    }

    if(key_state->state == libssh2_NB_state_sent2) {

        ret = curve25519_sha256(session, key_state->data, key_state->data_len,
                                key_state->curve25519_public_key,
                                key_state->curve25519_private_key,
                                &key_state->exchange_state);

        if(ret == LIBSSH2_ERROR_EAGAIN) {
            return ret;
        }

        LIBSSH2_FREE(session, key_state->data);
    }

clean_exit:

    if(key_state->curve25519_public_key) {
        _libssh2_explicit_zero(key_state->curve25519_public_key,
                               LIBSSH2_ED25519_KEY_LEN);
        LIBSSH2_FREE(session, key_state->curve25519_public_key);
        key_state->curve25519_public_key = NULL;
    }

    if(key_state->curve25519_private_key) {
        _libssh2_explicit_zero(key_state->curve25519_private_key,
                               LIBSSH2_ED25519_KEY_LEN);
        LIBSSH2_FREE(session, key_state->curve25519_private_key);
        key_state->curve25519_private_key = NULL;
    }

    key_state->state = libssh2_NB_state_idle;

    return ret;
}